

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMeshDecimator.cpp
# Opt level: O2

void __thiscall
HACD::MeshDecimator::GetMeshData(MeshDecimator *this,Vec3<double> *points,Vec3<long> *triangles)

{
  void *pvVar1;
  double *pdVar2;
  long *plVar3;
  bool *pbVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = this->m_nPoints;
  pvVar1 = operator_new__(-(ulong)(uVar8 >> 0x3d != 0) | uVar8 * 8);
  pbVar4 = &((this->m_vertices).super__Vector_base<HACD::MDVertex,_std::allocator<HACD::MDVertex>_>.
             _M_impl.super__Vector_impl_data._M_start)->m_tag;
  lVar5 = 0;
  pdVar2 = this->m_points->m_data + 2;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    if (*pbVar4 == true) {
      points[lVar5].m_data[0] = ((Vec3<double> *)(pdVar2 + -2))->m_data[0];
      points[lVar5].m_data[1] = pdVar2[-1];
      points[lVar5].m_data[2] = *pdVar2;
      *(long *)((long)pvVar1 + uVar7 * 8) = lVar5;
      lVar5 = lVar5 + 1;
    }
    pbVar4 = pbVar4 + 0x188;
    pdVar2 = pdVar2 + 3;
  }
  pbVar4 = this->m_trianglesTags;
  plVar3 = this->m_triangles->m_data + 2;
  lVar5 = 0;
  for (uVar8 = 0; uVar8 < this->m_nInitialTriangles; uVar8 = uVar8 + 1) {
    lVar6 = lVar5;
    if (pbVar4[uVar8] == true) {
      lVar6 = lVar5 + 1;
      triangles[lVar5].m_data[0] =
           *(long *)((long)pvVar1 + ((Vec3<long> *)(plVar3 + -2))->m_data[0] * 8);
      triangles[lVar5].m_data[1] = *(long *)((long)pvVar1 + plVar3[-1] * 8);
      triangles[lVar5].m_data[2] = *(long *)((long)pvVar1 + *plVar3 * 8);
    }
    plVar3 = plVar3 + 3;
    lVar5 = lVar6;
  }
  operator_delete__(pvVar1);
  return;
}

Assistant:

void MeshDecimator::GetMeshData(Vec3<Float> * points, Vec3<long> * triangles) const
	{
		long * map = new long [m_nPoints];
		long counter = 0;
		for (size_t v = 0; v < m_nPoints; ++v)
		{
			if ( m_vertices[v].m_tag )
			{
				points[counter] = m_points[v];
				map[v] = counter++;
			}
		}
		counter = 0;
		for (size_t t = 0; t < m_nInitialTriangles; ++t)
		{
			if ( m_trianglesTags[t] )
			{
				triangles[counter].X() = map[m_triangles[t].X()];
				triangles[counter].Y() = map[m_triangles[t].Y()];
				triangles[counter].Z() = map[m_triangles[t].Z()];
				counter++;
			}
		}
		delete [] map;
	}